

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O3

bool __thiscall
re2::Regexp::ParseState::PushRepeatOp(ParseState *this,RegexpOp op,StringPiece *s,bool nongreedy)

{
  byte bVar1;
  Regexp *pRVar2;
  RegexpStatus *pRVar3;
  ParseFlags parse_flags;
  size_type sVar4;
  bool bVar5;
  ParseState *this_00;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar6;
  ParseState *this_01;
  
  pRVar2 = this->stacktop_;
  if (pRVar2 != (Regexp *)0x0) {
    bVar1 = pRVar2->op_;
    if (bVar1 < (kRegexpCharClass|kRegexpEmptyMatch)) {
      parse_flags = this->flags_ ^ NonGreedy;
      if (!nongreedy) {
        parse_flags = this->flags_;
      }
      if ((bVar1 == op) && (parse_flags == pRVar2->parse_flags_)) {
        return true;
      }
      if ((bVar1 - 7 < 3) && (parse_flags == pRVar2->parse_flags_)) {
        pRVar2->op_ = '\a';
      }
      else {
        this_00 = (ParseState *)operator_new(0x28);
        this_01 = this_00;
        Regexp((Regexp *)this_00,op,parse_flags);
        *(uint16_t *)&this_00->field_0x6 = 1;
        pRVar2 = this->stacktop_;
        ((anon_union_8_2_3df47e5c_for_Regexp_7 *)&this_00->whole_regexp_)[1] =
             (anon_union_8_2_3df47e5c_for_Regexp_7)pRVar2->down_;
        FinishRegexp(this_01,pRVar2);
        if (*(ushort *)&this_00->field_0x6 < 2) {
          paVar6 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)&this_00->whole_regexp_;
        }
        else {
          paVar6 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)
                   ((anon_union_8_2_3df47e5c_for_Regexp_7 *)&this_00->whole_regexp_)->submany_;
        }
        paVar6->subone_ = pRVar2;
        bVar5 = ComputeSimple((Regexp *)this_00);
        *(bool *)((long)&this_00->flags_ + 1) = bVar5;
        this->stacktop_ = (Regexp *)this_00;
      }
      return true;
    }
  }
  pRVar3 = this->status_;
  pRVar3->code_ = kRegexpRepeatArgument;
  sVar4 = s->size_;
  (pRVar3->error_arg_).data_ = s->data_;
  (pRVar3->error_arg_).size_ = sVar4;
  return false;
}

Assistant:

bool Regexp::ParseState::PushRepeatOp(RegexpOp op, const StringPiece& s,
                                      bool nongreedy) {
  if (stacktop_ == NULL || IsMarker(stacktop_->op())) {
    status_->set_code(kRegexpRepeatArgument);
    status_->set_error_arg(s);
    return false;
  }
  Regexp::ParseFlags fl = flags_;
  if (nongreedy)
    fl = fl ^ NonGreedy;

  // Squash **, ++ and ??. Regexp::Star() et al. handle this too, but
  // they're mostly for use during simplification, not during parsing.
  if (op == stacktop_->op() && fl == stacktop_->parse_flags())
    return true;

  // Squash *+, *?, +*, +?, ?* and ?+. They all squash to *, so because
  // op is a repeat, we just have to check that stacktop_->op() is too,
  // then adjust stacktop_.
  if ((stacktop_->op() == kRegexpStar ||
       stacktop_->op() == kRegexpPlus ||
       stacktop_->op() == kRegexpQuest) &&
      fl == stacktop_->parse_flags()) {
    stacktop_->op_ = kRegexpStar;
    return true;
  }

  Regexp* re = new Regexp(op, fl);
  re->AllocSub(1);
  re->down_ = stacktop_->down_;
  re->sub()[0] = FinishRegexp(stacktop_);
  re->simple_ = re->ComputeSimple();
  stacktop_ = re;
  return true;
}